

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ValueDriver * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ValueDriver,slang::ast::DriverKind,slang::ast::ValueExpressionBase_const&,slang::ast::Symbol_const&,slang::bitmask<slang::ast::AssignFlags>&>
          (BumpAllocator *this,DriverKind *args,ValueExpressionBase *args_1,Symbol *args_2,
          bitmask<slang::ast::AssignFlags> *args_3)

{
  ValueDriver *this_00;
  
  this_00 = (ValueDriver *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ValueDriver *)this->endPtr < this_00 + 1) {
    this_00 = (ValueDriver *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  ast::ValueDriver::ValueDriver
            (this_00,*args,&args_1->super_Expression,args_2,
             (bitmask<slang::ast::AssignFlags>)args_3->m_bits);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }